

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O1

void __thiscall Shell::LispLexer::skipWhiteSpacesAndComments(LispLexer *this)

{
  ulong uVar1;
  bool bVar2;
  
  if ((this->super_Lexer)._eof == false) {
    bVar2 = false;
    do {
      uVar1 = (ulong)(uint)(this->super_Lexer)._lastCharacter;
      if (uVar1 < 0x3c) {
        if ((0x100003200U >> (uVar1 & 0x3f) & 1) == 0) {
          if (uVar1 == 10) {
            bVar2 = false;
          }
          else {
            if (uVar1 != 0x3b) goto LAB_0070fd1f;
            bVar2 = true;
          }
        }
      }
      else {
LAB_0070fd1f:
        if (!bVar2) {
          return;
        }
      }
      Lexer::readNextChar(&this->super_Lexer);
    } while ((this->super_Lexer)._eof != true);
  }
  return;
}

Assistant:

void LispLexer::skipWhiteSpacesAndComments ()
{
  bool comment = false;
  while (! _eof) {
    switch (_lastCharacter) {
    case ' ':
    case '\t':
    case '\r':
    case '\f':
      readNextChar();
      break;

    case '\n': // end-of-line comment (if any) finished
      comment = false;
      readNextChar();
      break;

    case ';': // Lisp comment sign
      comment = true;
      readNextChar();
      break;

    default:
      if (comment) {
	readNextChar();
	break;
      }
      return;
    }
  }
}